

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O1

Module * __thiscall hgdb::json::SymbolTable::add_module(SymbolTable *this,string *name)

{
  pointer pcVar1;
  Module *pMVar2;
  reference pvVar3;
  _Head_base<0UL,_hgdb::json::Module_*,_false> local_70;
  string local_68;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_emplace_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->top_names_,name);
  pMVar2 = (Module *)operator_new(0xf0);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + name->_M_string_length);
  local_48._8_8_ = 0;
  pcStack_30 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/src/../extern/hgdb/include/hgdb/json.hh:425:23)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/src/../extern/hgdb/include/hgdb/json.hh:425:23)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  Module::Module(pMVar2,&local_68,
                 (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_48);
  local_70._M_head_impl = pMVar2;
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pvVar3 = std::
           vector<std::unique_ptr<hgdb::json::Module,std::default_delete<hgdb::json::Module>>,std::allocator<std::unique_ptr<hgdb::json::Module,std::default_delete<hgdb::json::Module>>>>
           ::
           emplace_back<std::unique_ptr<hgdb::json::Module,std::default_delete<hgdb::json::Module>>>
                     ((vector<std::unique_ptr<hgdb::json::Module,std::default_delete<hgdb::json::Module>>,std::allocator<std::unique_ptr<hgdb::json::Module,std::default_delete<hgdb::json::Module>>>>
                       *)&this->modules_,
                      (unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *)
                      &local_70);
  pMVar2 = (pvVar3->_M_t).
           super___uniq_ptr_impl<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>._M_t.
           super__Tuple_impl<0UL,_hgdb::json::Module_*,_std::default_delete<hgdb::json::Module>_>.
           super__Head_base<0UL,_hgdb::json::Module_*,_false>._M_head_impl;
  if (local_70._M_head_impl != (Module *)0x0) {
    (*((local_70._M_head_impl)->super_Scope<hgdb::json::Module>).super_ScopeBase._vptr_ScopeBase[2])
              ();
  }
  return pMVar2;
}

Assistant:

Module *add_module(const std::string &name) {
        // no error check
        top_names_.emplace(name);
        return modules_
            .emplace_back(std::make_unique<Module>(
                name, [this](const std::string &name) { remove_module_top(name); }))
            .get();
    }